

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_type.cpp
# Opt level: O0

ExpressionType duckdb::NegateComparisonExpression(ExpressionType type)

{
  string *msg;
  undefined1 in_DIL;
  ExpressionType negated_type;
  allocator *this;
  allocator local_29;
  string local_28 [38];
  ExpressionType local_2;
  
  local_2 = 0;
  switch(in_DIL) {
  case 0x19:
    local_2 = COMPARE_NOTEQUAL;
    break;
  case 0x1a:
    local_2 = COMPARE_BOUNDARY_START;
    break;
  case 0x1b:
    local_2 = COMPARE_GREATERTHANOREQUALTO;
    break;
  case 0x1c:
    local_2 = COMPARE_LESSTHANOREQUALTO;
    break;
  case 0x1d:
    local_2 = COMPARE_GREATERTHAN;
    break;
  case 0x1e:
    local_2 = COMPARE_LESSTHAN;
    break;
  default:
    msg = (string *)__cxa_allocate_exception(0x10);
    this = &local_29;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_28,"Unsupported comparison type in negation",this);
    InternalException::InternalException((InternalException *)this,msg);
    __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
  }
  return local_2;
}

Assistant:

ExpressionType NegateComparisonExpression(ExpressionType type) {
	ExpressionType negated_type = ExpressionType::INVALID;
	switch (type) {
	case ExpressionType::COMPARE_EQUAL:
		negated_type = ExpressionType::COMPARE_NOTEQUAL;
		break;
	case ExpressionType::COMPARE_NOTEQUAL:
		negated_type = ExpressionType::COMPARE_EQUAL;
		break;
	case ExpressionType::COMPARE_LESSTHAN:
		negated_type = ExpressionType::COMPARE_GREATERTHANOREQUALTO;
		break;
	case ExpressionType::COMPARE_GREATERTHAN:
		negated_type = ExpressionType::COMPARE_LESSTHANOREQUALTO;
		break;
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		negated_type = ExpressionType::COMPARE_GREATERTHAN;
		break;
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		negated_type = ExpressionType::COMPARE_LESSTHAN;
		break;
	default:
		throw InternalException("Unsupported comparison type in negation");
	}
	return negated_type;
}